

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlkpp.cpp
# Opt level: O3

bool __thiscall
pg::ZLKPPSolver::do_step
          (ZLKPPSolver *this,int max_priority,int prec_cur,int prec_opo,int *num_nodes_in_h,
          bool *reached_bottom_cur,bool *reached_bottom_opo)

{
  bool bVar1;
  vector<int,_std::allocator<int>_> lose;
  vector<int,_std::allocator<int>_> top;
  vector<int,_std::allocator<int>_> local_a8;
  vector<int,_std::allocator<int>_> local_90;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  *num_nodes_in_h = 0x7fffffff;
  if (this->cur_num_nodes != 0) {
    if (this->min_dominion <= prec_opo) {
      this->iterations = this->iterations + 1;
      get_nodes_of_max_priority(&local_90,this,max_priority);
      get_attractor(this,max_priority % 2,&local_90);
      std::vector<int,_std::allocator<int>_>::vector(&local_48,&local_90);
      remove_nodes(this,&local_48);
      if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      solve(&local_a8,this,max_priority + -1,prec_opo,prec_cur,reached_bottom_opo,reached_bottom_cur
           );
      *num_nodes_in_h = this->cur_num_nodes;
      std::vector<int,_std::allocator<int>_>::vector(&local_60,&local_90);
      restore_nodes(this,&local_60);
      if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      bVar1 = get_attractor(this,(max_priority + -1) % 2,&local_a8);
      std::vector<int,_std::allocator<int>_>::vector(&local_78,&local_a8);
      remove_nodes(this,&local_78);
      if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start == (pointer)0x0) {
        return bVar1;
      }
      operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
      return bVar1;
    }
    *reached_bottom_opo = true;
  }
  return false;
}

Assistant:

bool ZLKPPSolver::do_step(int max_priority, int prec_cur, int prec_opo, int &num_nodes_in_h, bool &reached_bottom_cur, bool &reached_bottom_opo) {
    num_nodes_in_h = INT_MAX;
    if (!cur_num_nodes)
        return false;
    if (prec_opo < min_dominion) {
        reached_bottom_opo = true;
        return false;
    }
    ++iterations;
    assert(cur_num_nodes); // we assume that the current game is nonempty
    auto top = get_nodes_of_max_priority(max_priority);
    get_attractor(max_priority % 2, top);
    remove_nodes(top);
    auto lose = solve(max_priority - 1, prec_opo, prec_cur, reached_bottom_opo, reached_bottom_cur);
    num_nodes_in_h = cur_num_nodes;
    restore_nodes(top);
    bool changed = get_attractor((max_priority - 1) % 2, lose);
    remove_nodes(lose);
    return changed;
}